

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.cpp
# Opt level: O3

StringRef *
axl::cry::CryptoErrorProvider::getErrorDescription(StringRef *__return_storage_ptr__,ulong_t code)

{
  char *pcVar1;
  char *pcVar2;
  String errorString;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> SStack_48;
  
  pcVar1 = ERR_func_error_string(code);
  pcVar2 = ERR_reason_error_string(code);
  SStack_48.m_length._0_1_ = 0;
  SStack_48._17_8_ = 0;
  SStack_48.m_p = (C *)0x0;
  SStack_48.m_hdr._0_1_ = 0;
  SStack_48.m_hdr._1_7_ = 0;
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&SStack_48,"OpenSSL error 0x%x",
             code);
  if (pcVar1 != (char *)0x0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::appendFormat
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&SStack_48," in %s",pcVar1);
  }
  if (pcVar2 != (char *)0x0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::appendFormat
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&SStack_48,": %s",pcVar2);
  }
  *(undefined8 *)((long)&__return_storage_ptr__->m_hdr + 1) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->m_length + 1) = 0;
  __return_storage_ptr__->m_p = (C *)0x0;
  __return_storage_ptr__->m_hdr = (BufHdr *)0x0;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move
            (__return_storage_ptr__,&SStack_48);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&SStack_48);
  return __return_storage_ptr__;
}

Assistant:

sl::StringRef
CryptoErrorProvider::getErrorDescription(ulong_t code) {
	const char* functionString = ::ERR_func_error_string(code);
	const char* reasonString = ::ERR_reason_error_string(code);

	sl::String errorString;
	errorString.format("OpenSSL error 0x%x", code);

	if (functionString)
		errorString.appendFormat(" in %s", functionString);

	if (reasonString)
		errorString.appendFormat(": %s", reasonString);

	return errorString;
}